

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_RUBBLE(effect_handler_context_t_conflict *context)

{
  chunk_conflict *c;
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  loc_conflict grid_00;
  loc_conflict grid;
  wchar_t d;
  wchar_t iterations;
  wchar_t open_grids;
  wchar_t rubble_grids;
  effect_handler_context_t_conflict *context_local;
  
  uVar2 = Rand_div(3);
  wVar3 = count_neighbors((loc *)0x0,cave,player->grid,square_isempty,false);
  iterations = uVar2 + L'\x01';
  if (wVar3 < uVar2 + L'\x01') {
    iterations = wVar3;
  }
  for (grid.y = L'\0'; L'\0' < iterations && grid.y < L'\n'; grid.y = grid.y + L'\x01') {
    for (grid.x = L'\0'; grid.x < L'\b'; grid.x = grid.x + L'\x01') {
      grid_00 = (loc_conflict)loc_sum(player->grid,ddgrid_ddd[grid.x]);
      _Var1 = square_in_bounds_fully((chunk *)cave,grid_00);
      if (((_Var1) && (_Var1 = square_isempty((chunk *)cave,grid_00), _Var1)) &&
         (uVar2 = Rand_div(3), uVar2 == 0)) {
        uVar2 = Rand_div(2);
        if (uVar2 == 0) {
          square_set_feat((chunk *)cave,grid_00,FEAT_PASS_RUBBLE);
        }
        else {
          square_set_feat((chunk *)cave,grid_00,FEAT_RUBBLE);
        }
        c = cave;
        if (cave->depth == 0) {
          _Var1 = is_daytime();
          expose_to_sun((chunk *)c,(loc)grid_00,_Var1);
        }
        iterations = iterations + L'\xffffffff';
      }
    }
  }
  context->ident = true;
  player->upkeep->update = player->upkeep->update | 0xc0;
  player->upkeep->redraw = player->upkeep->redraw | 0xc00000;
  return true;
}

Assistant:

bool effect_handler_RUBBLE(effect_handler_context_t *context)
{
	/*
	 * First we work out how many grids we want to fill with rubble.  Then we
	 * check that we can actually do this, by counting the number of grids
	 * available, limiting the number of rubble grids to this number if
	 * necessary.
	 */
	int rubble_grids = randint1(3);
	int open_grids = count_neighbors(NULL, cave, player->grid,
		square_isempty, false);

	if (rubble_grids > open_grids) {
		rubble_grids = open_grids;
	}

	/* Avoid infinite loops */
	int iterations = 0;

	while (rubble_grids > 0 && iterations < 10) {
		/* Look around the player */
		for (int d = 0; d < 8; d++) {
			/* Extract adjacent (legal) location */
			struct loc grid = loc_sum(player->grid, ddgrid_ddd[d]);
			if (!square_in_bounds_fully(cave, grid)) continue;
			if (!square_isempty(cave, grid)) continue;

			if (one_in_(3)) {
				if (one_in_(2))
					square_set_feat(cave, grid, FEAT_PASS_RUBBLE);
				else
					square_set_feat(cave, grid, FEAT_RUBBLE);
				if (cave->depth == 0)
					expose_to_sun(cave, grid, is_daytime());
				rubble_grids--;
			}
		}

		iterations++;
	}

	context->ident = true;

	/* Fully update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw monster list */
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}